

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O1

uint32_t __thiscall spvtools::opt::Module::GetGlobalValue(Module *this,Op opcode)

{
  Op OVar1;
  Instruction *this_00;
  uint32_t in_EAX;
  Instruction *inst;
  
  this_00 = (this->types_values_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
            super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  while( true ) {
    if (this_00 == &(this->types_values_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_)
    {
      return 0;
    }
    OVar1 = this_00->opcode_;
    if ((OVar1 == opcode) && (in_EAX = 0, this_00->has_result_id_ == true)) {
      in_EAX = Instruction::GetSingleWordOperand(this_00,(uint)this_00->has_type_id_);
    }
    if (OVar1 == opcode) break;
    this_00 = (this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  }
  return in_EAX;
}

Assistant:

uint32_t Module::GetGlobalValue(spv::Op opcode) const {
  for (auto& inst : types_values_) {
    if (inst.opcode() == opcode) return inst.result_id();
  }
  return 0;
}